

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBench.c
# Opt level: O1

void Io_ReadBenchInit(Abc_Ntk_t *pNtk,char *pFileName)

{
  char cVar1;
  long *plVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  char pBuffer [1000];
  char acStack_418 [1000];
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Io_ReadBenchInit(): Failed to open file \"%s\".\n",pFileName);
    return;
  }
  pcVar4 = fgets(acStack_418,999,__stream);
  do {
    if (pcVar4 == (char *)0x0) {
      fclose(__stream);
      return;
    }
    pcVar4 = strtok(acStack_418," \n\t\r");
    uVar3 = Nm_ManFindIdByName(pNtk->pManName,pcVar4,5);
    if ((int)uVar3 < 0) {
      pcVar5 = "Io_ReadBenchInit(): Cannot find register with output %s.\n";
LAB_0032cd50:
      printf(pcVar5,pcVar4);
    }
    else {
      if (pNtk->vObjs->nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar2 = (long *)pNtk->vObjs->pArray[uVar3];
      plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 8) {
        pcVar5 = "Io_ReadBenchInit(): The signal is not a register output %s.\n";
        goto LAB_0032cd50;
      }
      pcVar4 = strtok((char *)0x0," \n\t\r");
      cVar1 = *pcVar4;
      if (cVar1 == '2') {
        if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                        ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
        }
        plVar2[7] = 3;
      }
      else if (cVar1 == '1') {
        if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                        ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
        }
        plVar2[7] = 2;
      }
      else if (cVar1 == '0') {
        if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                        ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
        }
        plVar2[7] = 1;
      }
      else {
        pcVar5 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                              (long)*(int *)plVar2[6] * 8));
        printf("Io_ReadBenchInit(): The signal %s has unknown initial value (%s).\n",pcVar5,pcVar4);
      }
    }
    pcVar4 = fgets(acStack_418,999,__stream);
  } while( true );
}

Assistant:

void Io_ReadBenchInit( Abc_Ntk_t * pNtk, char * pFileName )
{
    char pBuffer[1000];
    FILE * pFile;
    char * pToken;
    Abc_Obj_t * pObj;
    int Num;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Io_ReadBenchInit(): Failed to open file \"%s\".\n", pFileName );
        return;
    }
    while ( fgets( pBuffer, 999, pFile ) )
    {
        pToken = strtok( pBuffer, " \n\t\r" );
        // find the latch output
        Num = Nm_ManFindIdByName( pNtk->pManName, pToken, ABC_OBJ_BO );
        if ( Num < 0 )
        {
            printf( "Io_ReadBenchInit(): Cannot find register with output %s.\n", pToken );
            continue;
        }
        pObj = Abc_ObjFanin0( Abc_NtkObj( pNtk, Num ) );
        if ( !Abc_ObjIsLatch(pObj) )
        {
            printf( "Io_ReadBenchInit(): The signal is not a register output %s.\n", pToken );
            continue;
        }
        // assign the new init state
        pToken = strtok( NULL, " \n\t\r" );
        if ( pToken[0] == '0' )
            Abc_LatchSetInit0( pObj );
        else if ( pToken[0] == '1' )
            Abc_LatchSetInit1( pObj );
        else if ( pToken[0] == '2' )
            Abc_LatchSetInitDc( pObj );
        else
        {
            printf( "Io_ReadBenchInit(): The signal %s has unknown initial value (%s).\n", 
                Abc_ObjName(Abc_ObjFanout0(pObj)), pToken );
            continue;
        }
    }
    fclose( pFile );
}